

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O3

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::ModelBaseEKFFlexEstimatorIMU
          (ModelBaseEKFFlexEstimatorIMU *this,double dt)

{
  ExtendedKalmanFilter *this_00;
  IMUElasticLocalFrameDynamicalSystem *pIVar1;
  Vector *this_01;
  _func_int **pp_Var2;
  bool bVar3;
  _func_int *p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  uint uVar8;
  double *pdVar9;
  double *pdVar10;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar11;
  undefined8 *puVar12;
  Index index_4;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  Index index;
  ulong uVar17;
  ulong uVar18;
  Index size;
  long lVar19;
  undefined1 auVar20 [16];
  int iVar25;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar31;
  Vector dx;
  Vector x0;
  Vector3 v2;
  Vector3 v1;
  DenseStorage<double,__1,__1,_1,_0> local_f8;
  IMUElasticLocalFrameDynamicalSystem *local_e8;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_e0;
  undefined1 local_c0 [24];
  Scalar local_a8;
  Scalar local_a0;
  DenseStorage<double,__1,__1,_1,_0> local_98;
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  Matrix<double,_3,_1,_0,_3,_1> local_68;
  Matrix<double,_3,_1,_0,_3,_1> local_48;
  
  local_88._8_8_ = 1;
  local_88._0_8_ = 0x23;
  local_78 = 0x3e45798ee2308c3a;
  local_c0._16_8_ = dt;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_e0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_88);
  EKFFlexibilityEstimatorBase::EKFFlexibilityEstimatorBase
            (&this->super_EKFFlexibilityEstimatorBase,0x23,0xc,0x2a,(Vector *)&local_e0);
  free(local_e0.m_xpr);
  (this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
  _vptr_FlexibilityEstimatorBase = (_func_int **)&PTR__ModelBaseEKFFlexEstimatorIMU_0018f558;
  pIVar1 = &this->functor_;
  IMUElasticLocalFrameDynamicalSystem::IMUElasticLocalFrameDynamicalSystem
            (pIVar1,(double)local_c0._16_8_);
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  *(undefined1 (*) [16])
   &(this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (undefined1  [16])0x0;
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage =
       (DenseStorage<double,__1,__1,_1,_0>)0x0;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  this->stateSize_ = 0x23;
  uVar7 = _UNK_0017cfd8;
  this->unmodeledForceVariance_ = (double)_DAT_0017cfd0;
  this->forceVariance_ = (double)uVar7;
  this->absPosVariance_ = 0.0001;
  this->useFTSensors_ = false;
  this->withComBias_ = false;
  this->withAbsolutePos_ = false;
  this->withUnmodeledForces_ = false;
  this->limitOn_ = true;
  (this->op_).O.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->op_).O.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  *(undefined1 (*) [16])
   &(this->op_).O.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = (undefined1  [16])0x0;
  (this->op_).CA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->op_).CA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  (this->contactPositions_).
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->contactPositions_).
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->contactPositions_).
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8 = pIVar1;
  uVar8 = IMUElasticLocalFrameDynamicalSystem::getMeasurementSize(pIVar1);
  this_00 = &(this->super_EKFFlexibilityEstimatorBase).ekf_;
  KalmanFilterBase::setMeasureSize(&this_00->super_KalmanFilterBase,uVar8);
  KalmanFilterBase::setStateSize(&this_00->super_KalmanFilterBase,this->stateSize_);
  uVar8 = IMUElasticLocalFrameDynamicalSystem::getInputSize(pIVar1);
  ZeroDelayObserver::setInputSize((ZeroDelayObserver *)this_00,uVar8);
  uVar8 = IMUElasticLocalFrameDynamicalSystem::getInputSize(pIVar1);
  this->inputSize_ = uVar8;
  resetCovarianceMatrices(this);
  uVar8 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x13])(this);
  uVar17 = (ulong)uVar8;
  local_f8.m_data = (double *)0x0;
  local_f8.m_rows = 0;
  if (uVar8 == 0) {
    uVar13 = 0;
    pdVar9 = (double *)0x0;
LAB_00148422:
    uVar14 = 0;
  }
  else {
    pdVar9 = (double *)malloc(uVar17 * 8);
    if ((uVar8 != 1) && (((ulong)pdVar9 & 0xf) != 0)) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pdVar9 == (double *)0x0) {
      puVar12 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar12 = std::ios::widen;
      __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_f8.m_rows._0_4_ = uVar8;
    local_f8.m_data = pdVar9;
    local_f8.m_rows._4_4_ = 0;
    if (uVar8 == 1) {
      uVar13 = 1;
      goto LAB_00148422;
    }
    uVar14 = (ulong)(uVar8 & 0xfffffffe);
    uVar16 = 0;
    do {
      pdVar9[uVar16] = 1e-08;
      (pdVar9 + uVar16)[1] = 1e-08;
      uVar16 = uVar16 + 2;
      uVar13 = uVar17;
    } while (uVar16 < uVar14);
  }
  pIVar1 = local_e8;
  auVar6 = _DAT_00167020;
  auVar5 = _DAT_00167010;
  pdVar10 = pdVar9;
  if ((uint)uVar14 < uVar8) {
    lVar19 = (uVar17 - uVar14) + -1;
    auVar20._8_4_ = (int)lVar19;
    auVar20._0_8_ = lVar19;
    auVar20._12_4_ = (int)((ulong)lVar19 >> 0x20);
    uVar16 = 0;
    auVar20 = auVar20 ^ _DAT_00167020;
    do {
      auVar28._8_4_ = (int)uVar16;
      auVar28._0_8_ = uVar16;
      auVar28._12_4_ = (int)(uVar16 >> 0x20);
      auVar28 = (auVar28 | auVar5) ^ auVar6;
      bVar3 = auVar20._0_4_ < auVar28._0_4_;
      iVar25 = auVar20._4_4_;
      iVar31 = auVar28._4_4_;
      if ((bool)(~(iVar25 < iVar31 || iVar31 == iVar25 && bVar3) & 1)) {
        pdVar9[uVar14 + uVar16] = 1e-08;
      }
      if (iVar25 >= iVar31 && (iVar31 != iVar25 || !bVar3)) {
        pdVar9[uVar14 + uVar16 + 1] = 1e-08;
      }
      uVar16 = uVar16 + 2;
      pdVar10 = local_f8.m_data;
      uVar13 = local_f8.m_rows;
    } while (((uVar17 - uVar14) + 1 & 0xfffffffffffffffe) != uVar16);
  }
  auVar6 = _DAT_00167030;
  auVar5 = _DAT_00167020;
  if ((long)uVar13 < 6) goto LAB_00148b65;
  pdVar9 = pdVar10 + 3;
  uVar17 = 3;
  if (((ulong)pdVar9 & 7) == 0) {
    uVar17 = (ulong)((uint)((ulong)pdVar9 >> 3) & 1);
  }
  uVar14 = uVar17 ^ 3;
  uVar16 = (ulong)((uint)(1 < uVar14) * 2);
  uVar13 = uVar16 + uVar17;
  if (uVar17 == 0) {
LAB_001485d8:
    do {
      pdVar9[uVar17] = 0.0001;
      (pdVar9 + uVar17)[1] = 0.0001;
      uVar17 = uVar17 + 2;
    } while (uVar17 < uVar13);
  }
  else {
    lVar19 = uVar17 - 1;
    auVar21._8_4_ = (int)lVar19;
    auVar21._0_8_ = lVar19;
    auVar21._12_4_ = (int)((ulong)lVar19 >> 0x20);
    uVar18 = 0;
    auVar21 = auVar21 ^ _DAT_00167020;
    auVar26 = _DAT_00167010;
    do {
      bVar3 = auVar21._0_4_ < SUB164(auVar26 ^ auVar5,0);
      iVar25 = auVar21._4_4_;
      iVar31 = SUB164(auVar26 ^ auVar5,4);
      if ((bool)(~(iVar25 < iVar31 || iVar31 == iVar25 && bVar3) & 1)) {
        *(undefined8 *)((long)pdVar10 + uVar18 + 0x18) = 0x3f1a36e2eb1c432d;
      }
      if (iVar25 >= iVar31 && (iVar31 != iVar25 || !bVar3)) {
        *(undefined8 *)((long)pdVar10 + uVar18 + 0x20) = 0x3f1a36e2eb1c432d;
      }
      lVar19 = auVar26._8_8_;
      auVar26._0_8_ = auVar26._0_8_ + auVar6._0_8_;
      auVar26._8_8_ = lVar19 + auVar6._8_8_;
      uVar18 = uVar18 + 0x10;
    } while (((int)uVar17 * 8 + 8U & 0xfffffff0) != uVar18);
    if (1 < (uint)uVar14) goto LAB_001485d8;
  }
  auVar6 = _DAT_00167020;
  auVar5 = _DAT_00167010;
  if ((uint)uVar13 < 3) {
    lVar19 = uVar14 - uVar16;
    lVar15 = lVar19 + -1;
    auVar22._8_4_ = (int)lVar15;
    auVar22._0_8_ = lVar15;
    auVar22._12_4_ = (int)((ulong)lVar15 >> 0x20);
    uVar17 = 0;
    auVar22 = auVar22 ^ _DAT_00167020;
    do {
      auVar29._8_4_ = (int)uVar17;
      auVar29._0_8_ = uVar17;
      auVar29._12_4_ = (int)(uVar17 >> 0x20);
      auVar20 = (auVar29 | auVar5) ^ auVar6;
      bVar3 = auVar22._0_4_ < auVar20._0_4_;
      iVar25 = auVar22._4_4_;
      iVar31 = auVar20._4_4_;
      if ((bool)(~(iVar25 < iVar31 || iVar31 == iVar25 && bVar3) & 1)) {
        pdVar10[uVar13 + uVar17 + 3] = 0.0001;
      }
      if (iVar25 >= iVar31 && (iVar31 != iVar25 || !bVar3)) {
        pdVar10[uVar13 + uVar17 + 4] = 0.0001;
      }
      uVar17 = uVar17 + 2;
    } while ((lVar19 + 1U & 0xfffffffffffffffe) != uVar17);
  }
  auVar6 = _DAT_00167030;
  auVar5 = _DAT_00167020;
  if (local_f8.m_rows < 0xc) {
LAB_00148b65:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar9 = local_f8.m_data + 9;
  uVar17 = 3;
  if (((ulong)pdVar9 & 7) == 0) {
    uVar17 = (ulong)((uint)((ulong)pdVar9 >> 3) & 1);
  }
  uVar14 = uVar17 ^ 3;
  uVar16 = (ulong)((uint)(1 < uVar14) * 2);
  uVar13 = uVar16 + uVar17;
  if (uVar17 != 0) {
    lVar19 = uVar17 - 1;
    auVar23._8_4_ = (int)lVar19;
    auVar23._0_8_ = lVar19;
    auVar23._12_4_ = (int)((ulong)lVar19 >> 0x20);
    uVar18 = 0;
    auVar23 = auVar23 ^ _DAT_00167020;
    auVar27 = _DAT_00167010;
    do {
      bVar3 = auVar23._0_4_ < SUB164(auVar27 ^ auVar5,0);
      iVar25 = auVar23._4_4_;
      iVar31 = SUB164(auVar27 ^ auVar5,4);
      if ((bool)(~(iVar25 < iVar31 || iVar31 == iVar25 && bVar3) & 1)) {
        *(undefined8 *)((long)local_f8.m_data + uVar18 + 0x48) = 0x3f1a36e2eb1c432d;
      }
      if (iVar25 >= iVar31 && (iVar31 != iVar25 || !bVar3)) {
        *(undefined8 *)((long)local_f8.m_data + uVar18 + 0x50) = 0x3f1a36e2eb1c432d;
      }
      lVar19 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + auVar6._0_8_;
      auVar27._8_8_ = lVar19 + auVar6._8_8_;
      uVar18 = uVar18 + 0x10;
    } while (((int)uVar17 * 8 + 8U & 0xfffffff0) != uVar18);
    if ((uint)uVar14 < 2) goto LAB_0014878c;
  }
  do {
    pdVar9[uVar17] = 0.0001;
    (pdVar9 + uVar17)[1] = 0.0001;
    uVar17 = uVar17 + 2;
  } while (uVar17 < uVar13);
LAB_0014878c:
  auVar6 = _DAT_00167020;
  auVar5 = _DAT_00167010;
  if ((uint)uVar13 < 3) {
    lVar19 = uVar14 - uVar16;
    lVar15 = lVar19 + -1;
    auVar24._8_4_ = (int)lVar15;
    auVar24._0_8_ = lVar15;
    auVar24._12_4_ = (int)((ulong)lVar15 >> 0x20);
    uVar17 = 0;
    auVar24 = auVar24 ^ _DAT_00167020;
    do {
      auVar30._8_4_ = (int)uVar17;
      auVar30._0_8_ = uVar17;
      auVar30._12_4_ = (int)(uVar17 >> 0x20);
      auVar20 = (auVar30 | auVar5) ^ auVar6;
      bVar3 = auVar24._0_4_ < auVar20._0_4_;
      iVar25 = auVar24._4_4_;
      iVar31 = auVar20._4_4_;
      if ((bool)(~(iVar25 < iVar31 || iVar31 == iVar25 && bVar3) & 1)) {
        local_f8.m_data[uVar13 + uVar17 + 9] = 0.0001;
      }
      if (iVar25 >= iVar31 && (iVar31 != iVar25 || !bVar3)) {
        local_f8.m_data[uVar13 + uVar17 + 10] = 0.0001;
      }
      uVar17 = uVar17 + 2;
    } while ((lVar19 + 1U & 0xfffffffffffffffe) != uVar17);
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_98,&local_f8);
  EKFFlexibilityEstimatorBase::useFiniteDifferencesJacobians
            (&this->super_EKFFlexibilityEstimatorBase,(Vector *)&local_98);
  free(local_98.m_data);
  ObserverBase::stateVectorZero((ObserverBase *)local_c0);
  uVar7 = local_c0._0_8_;
  this_01 = &(this->super_EKFFlexibilityEstimatorBase).lastX_;
  if ((this->super_EKFFlexibilityEstimatorBase).lastX_.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      local_c0._8_8_) {
    if ((long)local_c0._8_8_ < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)this_01,local_c0._8_8_,local_c0._8_8_,1);
    if ((this->super_EKFFlexibilityEstimatorBase).lastX_.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
        local_c0._8_8_) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                   );
    }
  }
  pdVar9 = (this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  uVar17 = local_c0._8_8_ - ((long)local_c0._8_8_ >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)local_c0._8_8_) {
    lVar19 = 0;
    do {
      pp_Var2 = (_func_int **)(uVar7 + lVar19 * 8);
      p_Var4 = pp_Var2[1];
      pdVar10 = pdVar9 + lVar19;
      *pdVar10 = (double)*pp_Var2;
      pdVar10[1] = (double)p_Var4;
      lVar19 = lVar19 + 2;
    } while (lVar19 < (long)uVar17);
  }
  if ((long)uVar17 < (long)local_c0._8_8_) {
    do {
      pdVar9[uVar17] = (double)*(_func_int **)(uVar7 + uVar17 * 8);
      uVar17 = uVar17 + 1;
    } while (local_c0._8_8_ != uVar17);
  }
  ZeroDelayObserver::setState((ZeroDelayObserver *)this_00,(StateVector *)local_c0,0);
  KalmanFilterBase::setStateCovariance(&this_00->super_KalmanFilterBase,&this->Q_);
  ExtendedKalmanFilter::setFunctor(this_00,&pIVar1->super_DynamicalSystemFunctorBase);
  IMUElasticLocalFrameDynamicalSystem::setFDstep
            (pIVar1,&(this->super_EKFFlexibilityEstimatorBase).dx_);
  this->on_ = true;
  local_e0.m_xpr = &local_48;
  local_e0.m_row = 0;
  local_e0.m_col = 1;
  local_e0.m_currentBlockRows = 1;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       100.0;
  local_a0 = 100.0;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                      (&local_e0,&local_a0);
  local_a8 = 1000.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar11,&local_a8);
  if ((local_e0.m_currentBlockRows + local_e0.m_row == 3) && (local_e0.m_col == 1)) {
    local_e0.m_xpr = &local_68;
    local_e0.m_row = 0;
    local_e0.m_col = 1;
    local_e0.m_currentBlockRows = 1;
    local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = 10.0;
    local_a0 = 10.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                        (&local_e0,&local_a0);
    local_a8 = 100.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar11,&local_a8);
    if ((local_e0.m_currentBlockRows + local_e0.m_row == 3) && (local_e0.m_col == 1)) {
      local_88 = (undefined1  [16])0x0;
      local_78 = 0x4081651eb851eb85;
      uStack_70 = 0;
      (this->limitForces_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[0] =
           local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] * 0.0 +
           local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * 0.0 +
           local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] * 556.64;
      (this->limitForces_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[1] =
           local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] * 0.0 +
           local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * 556.64 +
           local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] * 0.0;
      (this->limitForces_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[2] =
           local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] * 556.64 +
           local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * 0.0 +
           local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] * 0.0;
      (this->limitTorques_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[0] =
           local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] * 0.0 +
           local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * 0.0 +
           local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] * 556.64;
      (this->limitTorques_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[1] =
           local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] * 0.0 +
           local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * 556.64 +
           local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] * 0.0;
      (this->limitTorques_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[2] =
           local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] * 556.64 +
           local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * 0.0 +
           local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] * 0.0;
      free((void *)local_c0._0_8_);
      free(local_f8.m_data);
      return;
    }
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
               );
}

Assistant:

ModelBaseEKFFlexEstimatorIMU::ModelBaseEKFFlexEstimatorIMU(double dt):
        EKFFlexibilityEstimatorBase
            (stateSize,measurementSizeBase_,inputSizeBase_,
                            Matrix::Constant(stateSize,1,dxFactor)),
        functor_(dt),
        stateSize_(stateSize),
        unmodeledForceVariance_(1e-6),
        forceVariance_(1e-4),
        absPosVariance_(1e-4),
        useFTSensors_(false),
        withAbsolutePos_(false),
        withComBias_(false),
        withUnmodeledForces_(false),
        limitOn_(true)
    {
        ekf_.setMeasureSize(functor_.getMeasurementSize());
        ekf_.setStateSize(stateSize_);
        ekf_.setInputSize(functor_.getInputSize());
        inputSize_=functor_.getInputSize();

        ModelBaseEKFFlexEstimatorIMU::resetCovarianceMatrices();

        Vector dx(Matrix::Constant(getStateSize(),1,dxFactor));

        dx.segment(state::ori,3).fill(1e-4) ;
        dx.segment(state::angVel,3).fill(1e-4) ;

        ModelBaseEKFFlexEstimatorIMU::useFiniteDifferencesJacobians(dx);

        Vector x0(ekf_.stateVectorZero());

        lastX_=x0;
        ekf_.setState(x0,0);

        ekf_.setStateCovariance(Q_);

        ekf_.setFunctor(& functor_);

        functor_.setFDstep(dx_);

        on_=true;

        Vector3 v1, v2;
        Matrix3 v;
        v1 << 100,
              100,
              1000;
        v2 << 10,
              10,
              100;
        v.setIdentity();
        v*=cst::gravityConstant*hrp2::m;
        limitForces_=v*v1;
        limitTorques_=v*v2;

    }